

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O1

int __thiscall xmrig::Client::resolve(Client *this,String *host)

{
  ushort uVar1;
  char *pcVar2;
  bool bVar3;
  undefined8 uVar4;
  int iVar5;
  
  if ((this->super_BaseClient).m_state != HostLookupState) {
    this->m_expire = 0;
    (this->super_BaseClient).m_state = HostLookupState;
  }
  (this->m_recvBuf).m_pos = 0;
  if ((this->super_BaseClient).m_failures == -1) {
    (this->super_BaseClient).m_failures = 0;
  }
  bVar3 = Dns::resolve(this->m_dns,host);
  iVar5 = 0;
  if (((!bVar3) && (iVar5 = 1, (this->super_BaseClient).m_quiet == false)) &&
     ((this->super_BaseClient).m_failures < (long)(this->super_BaseClient).m_retries)) {
    pcVar2 = host->m_data;
    uVar1 = (this->super_BaseClient).m_pool.m_url.m_port;
    uVar4 = uv_strerror(this->m_dns->m_status);
    Log::print(ERR,"[%s:%u] getaddrinfo error: \"%s\"",pcVar2,(ulong)uVar1,uVar4);
  }
  return iVar5;
}

Assistant:

int xmrig::Client::resolve(const String &host)
{
    setState(HostLookupState);

    m_recvBuf.reset();

    if (m_failures == -1) {
        m_failures = 0;
    }

    if (!m_dns->resolve(host)) {
        if (!isQuiet()) {
            LOG_ERR("[%s:%u] getaddrinfo error: \"%s\"", host.data(), m_pool.port(), uv_strerror(m_dns->status()));
        }

        return 1;
    }

    return 0;
}